

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void dirSAVEDEV(void)

{
  bool bVar1;
  int iVar2;
  uint badValue;
  int32_t iVar3;
  char *message;
  bool bVar4;
  long lVar5;
  int local_68;
  int32_t iStack_64;
  int local_60;
  path fnaam;
  
  bVar4 = DeviceID != (char *)0x0 && pass == 3;
  if ((bool)(~bVar4 & pass == 3)) {
    Error("SAVEDEV only allowed in real device emulation mode (See DEVICE)",(char *)0x0,PASS3);
  }
  local_60 = -1;
  _local_68 = 0xffffffffffffffff;
  GetOutputFileName_abi_cxx11_(&fnaam,&lp);
  for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 4) {
    bVar1 = comma(&lp);
    if (bVar1) {
      iVar2 = ParseExpression(&lp,(aint *)((long)&local_68 + lVar5));
      if (iVar2 == 0) goto LAB_0010d4ba;
    }
    else {
LAB_0010d4ba:
      Error("Expected syntax SAVEDEV <filename>,<startPage>,<startOffset>,<length>",bp,SUPPRESS);
      bVar4 = false;
    }
  }
  if (bVar4) {
    if ((local_68 < 0) || (Device->PagesCount <= local_68)) {
      ErrorInt("[SAVEDEV] page number is out of range",local_68,PASS3);
      bVar4 = false;
    }
    badValue = CDevice::GetMemoryOffset(Device,local_68,iStack_64);
    iVar3 = CDevice::GetMemoryOffset(Device,Device->PagesCount,0);
    if (bVar4) {
      if ((int)badValue < 0 || iVar3 <= (int)badValue) {
        message = "[SAVEDEV] calculated start address is out of range";
      }
      else {
        if ((0 < local_60) && ((int)(local_60 + badValue) <= iVar3)) {
          bVar4 = SaveDeviceMemory(&fnaam,(ulong)badValue,(long)local_60);
          if (!bVar4) {
            Error("[SAVEDEV] Error writing file (Disk full?)",bp,IF_FIRST);
          }
          goto LAB_0010d598;
        }
        if (local_60 == 0) {
          Warning("[SAVEDEV] zero length requested",(char *)0x0,W_PASS3);
          goto LAB_0010d598;
        }
        message = "[SAVEDEV] invalid end address (bad length?)";
        badValue = local_60 + badValue;
      }
      ErrorInt(message,badValue,PASS3);
    }
  }
LAB_0010d598:
  std::filesystem::__cxx11::path::~path(&fnaam);
  return;
}

Assistant:

static void dirSAVEDEV() {
	bool exec = DeviceID && LASTPASS == pass;
	if (!exec && LASTPASS == pass) Error("SAVEDEV only allowed in real device emulation mode (See DEVICE)");

	aint args[3]{-1, -1, -1};		// page, offset, length
	const std::filesystem::path fnaam = GetOutputFileName(lp);
	for (auto & arg : args) {
		if (!comma(lp) || !ParseExpression(lp, arg)) {
			exec = false;
			Error("Expected syntax SAVEDEV <filename>,<startPage>,<startOffset>,<length>", bp, SUPPRESS);
		}
	}
	if (exec) {
		// validate arguments
		if (args[0] < 0 || Device->PagesCount <= args[0]) {
			exec = false; ErrorInt("[SAVEDEV] page number is out of range", args[0]);
		}
		const int32_t start = Device->GetMemoryOffset(args[0], args[1]);
		const int32_t totalRam = Device->GetMemoryOffset(Device->PagesCount, 0);
		if (exec && (start < 0 || totalRam <= start)) {
			exec = false; ErrorInt("[SAVEDEV] calculated start address is out of range", start);
		}
		if (exec && (args[2] <= 0 || totalRam < start + args[2])) {
			exec = false;
			if (args[2]) ErrorInt("[SAVEDEV] invalid end address (bad length?)", start + args[2]);
			else Warning("[SAVEDEV] zero length requested");
		}
		if (exec && !SaveDeviceMemory(fnaam, (size_t)start, (size_t)args[2])) {
			Error("[SAVEDEV] Error writing file (Disk full?)", bp, IF_FIRST);
		}
	}
}